

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  int n;
  size_t N;
  
  while( true ) {
    while( true ) {
      printf("Enter how many numbers you\'d like to input (3-10): ");
      iVar1 = __isoc99_scanf("%zu",&N);
      if (iVar1 != 0) break;
      puts("Not a valid number!");
      __isoc99_scanf("%*[^\n]");
    }
    if (iVar1 != 1) goto LAB_0010125d;
    if (N - 3 < 8) break;
    puts("Must be between 3 and 10!");
  }
  uVar2 = 0;
  uVar3 = 0;
  while( true ) {
    while( true ) {
      if (N <= uVar3) {
        printf("The sum of these numbers is %d.\n",(ulong)uVar2);
        return 0;
      }
      printf("%zu-th number: ",uVar3 + 1);
      iVar1 = __isoc99_scanf("%d",&n);
      if (iVar1 != 0) break;
      puts("Not a valid number!");
      __isoc99_scanf("%*[^\n]");
    }
    if (iVar1 == -1) break;
    uVar2 = uVar2 + n;
    uVar3 = uVar3 + 1;
  }
LAB_0010125d:
  putchar(10);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  size_t N;

  while (true) { // Input N
    printf("Enter how many numbers you'd like to input (3-10): ");
    int res = scanf("%zu", &N);
    if (res == 1) {
      if (N > 2 && N < 11) break;
      else {
        printf("Must be between 3 and 10!\n");
      }
    } else if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
    } else {
      printf("\n");
      return 0;
    }
  }

  int sum = 0;

  for (size_t i = 0; i < N; i++) { // input each number and add it to sum
    int n;
    printf("%zu-th number: ", i + 1);

    const int res = scanf("%d", &n);
    if (res == 0) {
      printf("Not a valid number!\n");
      scanf("%*[^\n]");
      i--;
    } else if (res == EOF) {
      printf("\n");
      return 0;
    } else {
      sum += n;
    }
  }

  printf("The sum of these numbers is %d.\n", sum);

  return 0;
}